

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::InitCMAKE_CONFIGURATION_TYPES(cmMakefile *this,string *genDefault)

{
  bool bVar1;
  cmValue cVar2;
  allocator<char> local_7a;
  allocator<char> local_79;
  string initConfigs;
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&initConfigs,"CMAKE_CONFIGURATION_TYPES",(allocator<char> *)&local_58);
  cVar2 = GetDefinition(this,&initConfigs);
  std::__cxx11::string::~string((string *)&initConfigs);
  if (cVar2.Value == (string *)0x0) {
    initConfigs._M_dataplus._M_p = (pointer)&initConfigs.field_2;
    initConfigs._M_string_length = 0;
    initConfigs.field_2._M_local_buf[0] = '\0';
    bVar1 = cmake::GetIsInTryCompile(this->GlobalGenerator->CMakeInstance);
    if ((bVar1) ||
       (bVar1 = cmsys::SystemTools::GetEnv("CMAKE_CONFIGURATION_TYPES",&initConfigs), !bVar1)) {
      std::__cxx11::string::_M_assign((string *)&initConfigs);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"CMAKE_CONFIGURATION_TYPES",&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              (local_38,
               "Semicolon separated list of supported configuration types, only supports Debug, Release, MinSizeRel, and RelWithDebInfo, anything else will be ignored."
               ,&local_7a);
    AddCacheDefinition(this,&local_58,&initConfigs,(string *)local_38,STRING,false);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&initConfigs);
    return;
  }
  return;
}

Assistant:

void cmMakefile::InitCMAKE_CONFIGURATION_TYPES(std::string const& genDefault)
{
  if (this->GetDefinition("CMAKE_CONFIGURATION_TYPES")) {
    return;
  }
  std::string initConfigs;
  if (this->GetCMakeInstance()->GetIsInTryCompile() ||
      !cmSystemTools::GetEnv("CMAKE_CONFIGURATION_TYPES", initConfigs)) {
    initConfigs = genDefault;
  }
  this->AddCacheDefinition(
    "CMAKE_CONFIGURATION_TYPES", initConfigs,
    "Semicolon separated list of supported configuration types, "
    "only supports Debug, Release, MinSizeRel, and RelWithDebInfo, "
    "anything else will be ignored.",
    cmStateEnums::STRING);
}